

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O0

void BrotliEncoderDestroyPreparedDictionary(BrotliEncoderPreparedDictionary *dictionary)

{
  MemoryManager *in_RDI;
  ManagedDictionary *dict;
  SharedEncoderDictionary *in_stack_ffffffffffffffe8;
  
  if ((in_RDI != (MemoryManager *)0x0) && (*(int *)&in_RDI->alloc_func == -0x2143121e)) {
    if (in_RDI[1].free_func != (brotli_free_func)0x0) {
      if (*(int *)in_RDI[1].free_func == -0x2143121d) {
        duckdb_brotli::DestroyPreparedDictionary
                  (in_RDI,(PreparedDictionary *)in_stack_ffffffffffffffe8);
      }
      else if (*(int *)in_RDI[1].free_func == -0x2143121f) {
        duckdb_brotli::BrotliCleanupSharedEncoderDictionary(in_RDI,in_stack_ffffffffffffffe8);
        duckdb_brotli::BrotliFree(in_RDI,in_stack_ffffffffffffffe8);
      }
    }
    in_RDI[1].free_func = (brotli_free_func)0x0;
    duckdb_brotli::BrotliDestroyManagedDictionary((ManagedDictionary *)0x78cb78);
  }
  return;
}

Assistant:

void BrotliEncoderDestroyPreparedDictionary(
    BrotliEncoderPreparedDictionary* dictionary) {
  ManagedDictionary* dict = (ManagedDictionary*)dictionary;
  if (!dictionary) return;
  /* First field of dictionary structs. */
  /* Only managed dictionaries are eligible for destruction by this method. */
  if (dict->magic != kManagedDictionaryMagic) {
    return;
  }
  if (dict->dictionary == NULL) {
    /* This should never ever happen. */
  } else if (*dict->dictionary == kLeanPreparedDictionaryMagic) {
    DestroyPreparedDictionary(
        &dict->memory_manager_, (PreparedDictionary*)dict->dictionary);
  } else if (*dict->dictionary == kSharedDictionaryMagic) {
    BrotliCleanupSharedEncoderDictionary(&dict->memory_manager_,
        (SharedEncoderDictionary*)dict->dictionary);
    BrotliFree(&dict->memory_manager_, dict->dictionary);
  } else {
    /* There is also kPreparedDictionaryMagic, but such instances should be
     * constructed and destroyed by different means. */
  }
  dict->dictionary = NULL;
  BrotliDestroyManagedDictionary(dict);
}